

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_observation.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiObservation::HanabiObservation
          (HanabiObservation *this,HanabiState *state,int observing_player)

{
  vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_> *this_00
  ;
  byte bVar1;
  int iVar2;
  AgentObservationType AVar3;
  HanabiGame *pHVar4;
  ulong uVar5;
  uint __line;
  pointer pHVar6;
  long lVar7;
  char *__function;
  int iVar8;
  long lVar9;
  pointer pHVar10;
  int offset;
  pointer pHVar11;
  char *__assertion;
  __normal_iterator<const_hanabi_learning_env::HanabiHistoryItem_*,_std::vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>_>
  __tmp;
  pointer pHVar12;
  HanabiHand local_60;
  
  iVar8 = state->cur_player_;
  if (-1 < iVar8) {
    iVar2 = state->parent_game_->num_players_;
    iVar8 = ((iVar8 - observing_player) + iVar2) % iVar2;
  }
  this->cur_player_offset_ = iVar8;
  this_00 = &this->hands_;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hands_).
  super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector(&this->discard_pile_,&state->discard_pile_);
  std::vector<int,_std::allocator<int>_>::vector(&this->fireworks_,&state->fireworks_);
  this->deck_size_ = (state->deck_).total_count_;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_moves_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = state->life_tokens_;
  this->information_tokens_ = state->information_tokens_;
  this->life_tokens_ = iVar8;
  HanabiState::LegalMoves(&this->legal_moves_,state,observing_player);
  pHVar4 = state->parent_game_;
  this->parent_game_ = pHVar4;
  if ((observing_player < 0) || (pHVar4->num_players_ <= observing_player)) {
    __assertion = "observing_player >= 0 && observing_player < state.ParentGame()->NumPlayers()";
    __function = 
    "hanabi_learning_env::HanabiObservation::HanabiObservation(const HanabiState &, int)";
    __line = 0x40;
LAB_00118943:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_observation.cc"
                  ,__line,__function);
  }
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  reserve(this_00,((long)(state->hands_).
                         super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(state->hands_).
                        super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  AVar3 = state->parent_game_->observation_type_;
  HanabiHand::HanabiHand
            (&local_60,
             (state->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start + (uint)observing_player,AVar3 != kSeer,
             AVar3 == kMinimal);
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  emplace_back<hanabi_learning_env::HanabiHand>(this_00,&local_60);
  HanabiHand::~HanabiHand(&local_60);
  for (iVar8 = 1; iVar2 = state->parent_game_->num_players_, iVar8 < iVar2; iVar8 = iVar8 + 1) {
    HanabiHand::HanabiHand
              (&local_60,
               (state->hands_).
               super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
               ._M_impl.super__Vector_impl_data._M_start +
               ((long)(iVar8 + observing_player) % (long)iVar2 & 0xffffffff),false,AVar3 == kMinimal
              );
    std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
    emplace_back<hanabi_learning_env::HanabiHand>(this_00,&local_60);
    HanabiHand::~HanabiHand(&local_60);
  }
  pHVar6 = (state->move_history_).
           super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar12 = (state->move_history_).
            super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pHVar12 - (long)pHVar6;
  pHVar6 = pHVar6 + 2;
  for (lVar9 = lVar7 >> 6; 0 < lVar9; lVar9 = lVar9 + -1) {
    if (pHVar6[-2].player != -1) {
      pHVar11 = pHVar6 + -2;
      goto LAB_00118831;
    }
    if (pHVar6[-1].player != -1) {
      pHVar11 = pHVar6 + -1;
      goto LAB_00118831;
    }
    pHVar11 = pHVar6;
    if (pHVar6->player != -1) goto LAB_00118831;
    if (pHVar6[1].player != -1) {
      pHVar11 = pHVar6 + 1;
      goto LAB_00118831;
    }
    pHVar6 = pHVar6 + 4;
    lVar7 = lVar7 + -0x40;
  }
  lVar7 = lVar7 >> 4;
  pHVar10 = pHVar6 + -2;
  if (lVar7 != 1) {
    if (lVar7 == 3) {
      pHVar11 = pHVar10;
      if (pHVar6[-2].player != -1) goto LAB_00118831;
      pHVar10 = pHVar6 + -1;
    }
    else {
      pHVar11 = pHVar12;
      if (lVar7 != 2) goto LAB_00118831;
    }
    pHVar11 = pHVar10;
    if (pHVar10->player != -1) goto LAB_00118831;
    pHVar10 = pHVar10 + 1;
  }
  pHVar11 = pHVar10;
  if (pHVar10->player == -1) {
    pHVar11 = pHVar12;
  }
LAB_00118831:
  do {
    if (pHVar12 == pHVar11) {
      return;
    }
    std::
    vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
    ::push_back(&this->last_moves_,pHVar12 + -1);
    iVar8 = state->parent_game_->num_players_;
    pHVar6 = (this->last_moves_).
             super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar1 = pHVar6[-1].player;
    if (pHVar6[-1].move.move_type_ == kDeal) {
      if ((-1 < (char)bVar1) || (pHVar6[-1].deal_to_player < '\0')) {
        __assertion = "item->player < 0 && item->deal_to_player >= 0";
        __function = 
        "void hanabi_learning_env::(anonymous namespace)::ChangeHistoryItemToObserverRelative(int, int, bool, HanabiHistoryItem *)"
        ;
        __line = 0x26;
        goto LAB_00118943;
      }
      uVar5 = (long)((iVar8 - observing_player) + (int)pHVar6[-1].deal_to_player) % (long)iVar8;
      pHVar6[-1].deal_to_player = (int8_t)uVar5;
      if ((AVar3 != kSeer) && ((uVar5 & 0xff) == 0)) {
        pHVar6[-1].move.move_type_ = kDeal;
        pHVar6[-1].move.card_index_ = -1;
        pHVar6[-1].move.target_offset_ = -1;
        pHVar6[-1].move.color_ = -1;
        pHVar6[-1].move.rank_ = -1;
      }
    }
    else {
      if ((char)bVar1 < '\0') {
        __assertion = "item->player >= 0";
        __function = 
        "void hanabi_learning_env::(anonymous namespace)::ChangeHistoryItemToObserverRelative(int, int, bool, HanabiHistoryItem *)"
        ;
        __line = 0x2e;
        goto LAB_00118943;
      }
      pHVar6[-1].player = (int8_t)((int)((iVar8 - observing_player) + (uint)bVar1) % iVar8);
    }
    pHVar6 = pHVar12 + -1;
    pHVar12 = pHVar12 + -1;
    if (pHVar6->player == observing_player) {
      return;
    }
  } while( true );
}

Assistant:

HanabiObservation::HanabiObservation(const HanabiState& state,
                                     int observing_player)
    : cur_player_offset_(PlayerToOffset(state.CurPlayer(), observing_player,
                                        state.ParentGame()->NumPlayers())),
      discard_pile_(state.DiscardPile()),
      fireworks_(state.Fireworks()),
      deck_size_(state.Deck().Size()),
      information_tokens_(state.InformationTokens()),
      life_tokens_(state.LifeTokens()),
      legal_moves_(state.LegalMoves(observing_player)),
      parent_game_(state.ParentGame()) {
  REQUIRE(observing_player >= 0 &&
          observing_player < state.ParentGame()->NumPlayers());
  hands_.reserve(state.Hands().size());
  const bool hide_knowledge =
      state.ParentGame()->ObservationType() == HanabiGame::kMinimal;
  const bool show_cards = state.ParentGame()->ObservationType() == HanabiGame::kSeer;
  hands_.push_back(
      HanabiHand(state.Hands()[observing_player], !show_cards, hide_knowledge));
  for (int offset = 1; offset < state.ParentGame()->NumPlayers(); ++offset) {
    hands_.push_back(HanabiHand(state.Hands()[(observing_player + offset) %
                                              state.ParentGame()->NumPlayers()],
                                false, hide_knowledge));
  }

  const auto& history = state.MoveHistory();
  auto start = std::find_if(history.begin(), history.end(),
                            [](const HanabiHistoryItem& item) {
                              return item.player != kChancePlayerId;
                            });
  std::reverse_iterator<decltype(start)> rend(start);
  for (auto it = history.rbegin(); it != rend; ++it) {
    last_moves_.push_back(*it);
    ChangeHistoryItemToObserverRelative(observing_player,
                                        state.ParentGame()->NumPlayers(),
                                        show_cards,
                                        &last_moves_.back());
    if (it->player == observing_player) {
      break;
    }
  }
}